

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Int_t * Acb_DeriveWeights(Vec_Int_t *vDivs,Acb_Ntk_t *pNtkF)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Int_t *vWeights;
  int iDiv;
  int i;
  Acb_Ntk_t *pNtkF_local;
  Vec_Int_t *vDivs_local;
  
  iVar1 = Vec_IntSize(vDivs);
  p = Vec_IntAlloc(iVar1);
  for (vWeights._4_4_ = 0; iVar1 = Vec_IntSize(vDivs), vWeights._4_4_ < iVar1;
      vWeights._4_4_ = vWeights._4_4_ + 1) {
    iVar1 = Vec_IntEntry(vDivs,vWeights._4_4_);
    iVar1 = Vec_IntEntry(&pNtkF->vObjWeight,iVar1);
    Vec_IntPush(p,iVar1);
  }
  return p;
}

Assistant:

Vec_Int_t * Acb_DeriveWeights( Vec_Int_t * vDivs, Acb_Ntk_t * pNtkF )
{
    int i, iDiv;
    Vec_Int_t * vWeights = Vec_IntAlloc( Vec_IntSize(vDivs) );
    Vec_IntForEachEntry( vDivs, iDiv, i )
        Vec_IntPush( vWeights, Vec_IntEntry(&pNtkF->vObjWeight, iDiv) );
    return vWeights;
}